

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void sf::priv::GlContext::cleanupResource(void)

{
  Lock local_10;
  Lock lock;
  
  Lock::Lock(&local_10,(Mutex *)&(anonymous_namespace)::mutex);
  (anonymous_namespace)::resourceCount = (anonymous_namespace)::resourceCount + -1;
  if (((anonymous_namespace)::resourceCount == 0) &&
     ((anonymous_namespace)::sharedContext != (long *)0x0)) {
    if ((anonymous_namespace)::sharedContext != (long *)0x0) {
      (**(code **)(*(anonymous_namespace)::sharedContext + 8))();
    }
    (anonymous_namespace)::sharedContext = (long *)0x0;
  }
  Lock::~Lock(&local_10);
  return;
}

Assistant:

void GlContext::cleanupResource()
{
    // Protect from concurrent access
    Lock lock(mutex);

    // Decrement the resources counter
    resourceCount--;

    // If there's no more resource alive, we can trigger the global context cleanup
    if (resourceCount == 0)
    {
        if (!sharedContext)
            return;

        // Destroy the shared context
        delete sharedContext;
        sharedContext = NULL;
    }
}